

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::generic_parser_base::printGenericOptionDiff
          (generic_parser_base *this,Option *O,GenericOptionValue *Value,GenericOptionValue *Default
          ,size_t GlobalWidth)

{
  uint uVar1;
  int iVar2;
  raw_ostream *prVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t extraout_RDX;
  ulong extraout_RDX_00;
  size_t extraout_RDX_01;
  uint j;
  uint uVar4;
  uint i;
  uint uVar5;
  char *Str;
  StringRef Str_00;
  StringRef Str_01;
  
  prVar3 = outs();
  prVar3 = raw_ostream::operator<<(prVar3,"  -");
  raw_ostream::operator<<(prVar3,O->ArgStr);
  prVar3 = outs();
  raw_ostream::indent(prVar3,(int)GlobalWidth - (int)(O->ArgStr).Length);
  uVar1 = (*this->_vptr_generic_parser_base[2])(this);
  Str = "= *unknown option value*\n";
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = (*this->_vptr_generic_parser_base[6])(this,(ulong)uVar5);
    iVar2 = (**Value->_vptr_GenericOptionValue)(Value,CONCAT44(extraout_var,iVar2));
    if ((char)iVar2 == '\0') {
      prVar3 = outs();
      prVar3 = raw_ostream::operator<<(prVar3,"= ");
      iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar5);
      Str_00.Data._4_4_ = extraout_var_00;
      Str_00.Data._0_4_ = iVar2;
      Str_00.Length = extraout_RDX;
      raw_ostream::operator<<(prVar3,Str_00);
      (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar5);
      uVar4 = 0;
      uVar5 = 0;
      if (extraout_RDX_00 < 9) {
        uVar5 = 8 - (int)extraout_RDX_00;
      }
      prVar3 = outs();
      prVar3 = raw_ostream::indent(prVar3,uVar5);
      raw_ostream::operator<<(prVar3," (default: ");
      Str = ")\n";
      goto LAB_0013c39c;
    }
  }
LAB_0013c3e0:
  prVar3 = outs();
  raw_ostream::operator<<(prVar3,Str);
  return;
LAB_0013c39c:
  if (uVar1 == uVar4) goto LAB_0013c3e0;
  iVar2 = (*this->_vptr_generic_parser_base[6])(this,(ulong)uVar4);
  iVar2 = (**Default->_vptr_GenericOptionValue)(Default,CONCAT44(extraout_var_01,iVar2));
  if ((char)iVar2 == '\0') {
    prVar3 = outs();
    iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar4);
    Str_01.Data._4_4_ = extraout_var_02;
    Str_01.Data._0_4_ = iVar2;
    Str_01.Length = extraout_RDX_01;
    raw_ostream::operator<<(prVar3,Str_01);
    goto LAB_0013c3e0;
  }
  uVar4 = uVar4 + 1;
  goto LAB_0013c39c;
}

Assistant:

void generic_parser_base::printGenericOptionDiff(
    const Option &O, const GenericOptionValue &Value,
    const GenericOptionValue &Default, size_t GlobalWidth) const {
  outs() << "  -" << O.ArgStr;
  outs().indent(GlobalWidth - O.ArgStr.size());

  unsigned NumOpts = getNumOptions();
  for (unsigned i = 0; i != NumOpts; ++i) {
    if (Value.compare(getOptionValue(i)))
      continue;

    outs() << "= " << getOption(i);
    size_t L = getOption(i).size();
    size_t NumSpaces = MaxOptWidth > L ? MaxOptWidth - L : 0;
    outs().indent(NumSpaces) << " (default: ";
    for (unsigned j = 0; j != NumOpts; ++j) {
      if (Default.compare(getOptionValue(j)))
        continue;
      outs() << getOption(j);
      break;
    }
    outs() << ")\n";
    return;
  }
  outs() << "= *unknown option value*\n";
}